

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O1

int singlylinkedlist_remove_if
              (SINGLYLINKEDLIST_HANDLE list,LIST_CONDITION_FUNCTION condition_function,
              void *match_context)

{
  LIST_ITEM_INSTANCE *pLVar1;
  _Bool _Var2;
  ulong in_RAX;
  LOGGER_LOG p_Var3;
  SINGLYLINKEDLIST_HANDLE pSVar4;
  LIST_ITEM_INSTANCE *__ptr;
  int iVar5;
  LIST_ITEM_INSTANCE *pLVar6;
  LIST_INSTANCE *list_instance;
  ulong uStack_38;
  _Bool continue_processing;
  
  if (list == (SINGLYLINKEDLIST_HANDLE)0x0 || condition_function == (LIST_CONDITION_FUNCTION)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x117;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_remove_if",0x116,1,
                "Invalid argument (list=%p, condition_function=%p)",list,condition_function);
    }
  }
  else {
    pLVar6 = (LIST_ITEM_INSTANCE *)0x0;
    __ptr = list->head;
    uStack_38 = in_RAX;
    do {
      if (__ptr == (LIST_ITEM_INSTANCE *)0x0) break;
      uStack_38 = uStack_38 & 0xffffffffffffff;
      pLVar1 = (LIST_ITEM_INSTANCE *)__ptr->next;
      _Var2 = (*condition_function)(__ptr->item,match_context,&continue_processing);
      if (_Var2) {
        pSVar4 = (SINGLYLINKEDLIST_HANDLE)&pLVar6->next;
        if (pLVar6 == (LIST_ITEM_INSTANCE *)0x0) {
          pSVar4 = list;
        }
        pSVar4->head = pLVar1;
        if (__ptr == list->tail) {
          list->tail = pLVar6;
        }
        free(__ptr);
        __ptr = pLVar6;
      }
      pLVar6 = __ptr;
      __ptr = pLVar1;
    } while (continue_processing != false);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int singlylinkedlist_remove_if(SINGLYLINKEDLIST_HANDLE list, LIST_CONDITION_FUNCTION condition_function, const void* match_context)
{
    int result;
    /* Codes_SRS_LIST_09_001: [ If the list or the condition_function argument is NULL, singlylinkedlist_remove_if shall return non-zero value. ] */
    if ((list == NULL) ||
        (condition_function == NULL))
    {
        LogError("Invalid argument (list=%p, condition_function=%p)", list, condition_function);
        result = MU_FAILURE;
    }
    else
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;
        LIST_ITEM_INSTANCE* current_item = list_instance->head;
        LIST_ITEM_INSTANCE* next_item = NULL;
        LIST_ITEM_INSTANCE* previous_item = NULL;

        /* Codes_SRS_LIST_09_002: [ singlylinkedlist_remove_if shall iterate through all items in a list and remove all that satisfies a certain condition function. ] */
        while (current_item != NULL)
        {
            bool continue_processing = false;

            next_item = (LIST_ITEM_INSTANCE*)current_item->next;

            /* Codes_SRS_LIST_09_003: [ singlylinkedlist_remove_if shall determine whether an item satisfies the condition criteria by invoking the condition function for that item. ] */
            /* Codes_SRS_LIST_09_004: [ If the condition function returns true, singlylinkedlist_find shall consider that item as to be removed. ] */
            if (condition_function(current_item->item, match_context, &continue_processing) == true)
            {
                if (previous_item != NULL)
                {
                    previous_item->next = next_item;
                }
                else
                {
                    list_instance->head = next_item;
                }

                if (current_item == list_instance->tail)
                {
                    list_instance->tail = previous_item;
                }

                free(current_item);
            }
            /* Codes_SRS_LIST_09_005: [ If the condition function returns false, singlylinkedlist_find shall consider that item as not to be removed. ] */
            else
            {
                previous_item = current_item;
            }

            /* Codes_SRS_LIST_09_006: [ If the condition function returns continue_processing as false, singlylinkedlist_remove_if shall stop iterating through the list and return. ] */
            if (continue_processing == false)
            {
                break;
            }

            current_item = next_item;
        }

        /* Codes_SRS_LIST_09_007: [ If no errors occur, singlylinkedlist_remove_if shall return zero. ] */
        result = 0;
    }

    return result;
}